

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional_ref.hpp
# Opt level: O2

optional<debugger_type> __thiscall
type_safe::move<debugger_type>(type_safe *this,optional_xvalue_ref<debugger_type> *ref)

{
  debugger_type *pdVar1;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  type_safe tVar2;
  optional<debugger_type> oVar3;
  
  tVar2 = (type_safe)
          ((ref->super_optional_storage<type_safe::reference_optional_storage<debugger_type,_true>_>
           ).storage.pointer_ == (debugger_type *)0x0);
  if (!(bool)tVar2) {
    pdVar1 = basic_optional<type_safe::reference_optional_storage<debugger_type,_true>_>::value(ref)
    ;
    *(int *)this = pdVar1->id;
    *(undefined4 *)(this + 4) = 0;
    *(undefined2 *)(this + 8) = 0;
    *(undefined2 *)(this + 4) = 0x101;
    in_RDX = extraout_RDX;
  }
  this[0xc] = tVar2;
  oVar3.super_optional_storage<type_safe::direct_optional_storage<debugger_type>_>.storage.storage_
  [8] = (char)in_RDX;
  oVar3.super_optional_storage<type_safe::direct_optional_storage<debugger_type>_>.storage.storage_
  [9] = (char)((ulong)in_RDX >> 8);
  oVar3.super_optional_storage<type_safe::direct_optional_storage<debugger_type>_>.storage.storage_
  [10] = (char)((ulong)in_RDX >> 0x10);
  oVar3.super_optional_storage<type_safe::direct_optional_storage<debugger_type>_>.storage.storage_
  [0xb] = (char)((ulong)in_RDX >> 0x18);
  oVar3.super_optional_storage<type_safe::direct_optional_storage<debugger_type>_>.storage.empty_ =
       (bool)(char)((ulong)in_RDX >> 0x20);
  oVar3.super_optional_storage<type_safe::direct_optional_storage<debugger_type>_>.storage._13_3_ =
       (int3)((ulong)in_RDX >> 0x28);
  oVar3.super_optional_storage<type_safe::direct_optional_storage<debugger_type>_>.storage.storage_.
  _0_8_ = this;
  return (optional<debugger_type>)
         oVar3.super_optional_storage<type_safe::direct_optional_storage<debugger_type>_>.storage;
}

Assistant:

optional<T> move(const optional_xvalue_ref<T>& ref) noexcept(
    std::is_nothrow_move_constructible<T>::value)
{
    return ref.has_value() ? type_safe::make_optional(ref.value()) : nullopt;
}